

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Catch.h
# Opt level: O2

void __thiscall Catch::Session::showHelp(Session *this,string *processName)

{
  char *__lhs;
  bool bVar1;
  ostream *poVar2;
  allocator local_49;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"\nCatch v");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  poVar2 = std::operator<<(poVar2,".");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  poVar2 = std::operator<<(poVar2," build ");
  std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  __lhs = DAT_00165408;
  std::__cxx11::string::string((string *)&local_48,"master",&local_49);
  bVar1 = std::operator!=(__lhs,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout," (");
    poVar2 = std::operator<<(poVar2,DAT_00165408);
    std::operator<<(poVar2," branch)");
  }
  std::operator<<((ostream *)&std::cout,"\n");
  Clara::CommandLine<Catch::ConfigData>::usage(&this->m_cli,(ostream *)&std::cout,processName);
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "For more detail usage please see the project docs\n");
  std::endl<char,std::char_traits<char>>(poVar2);
  return;
}

Assistant:

void showHelp( std::string const& processName ) {
            std::cout << "\nCatch v"    << libraryVersion.majorVersion << "."
                                        << libraryVersion.minorVersion << " build "
                                        << libraryVersion.buildNumber;
            if( libraryVersion.branchName != std::string( "master" ) )
                std::cout << " (" << libraryVersion.branchName << " branch)";
            std::cout << "\n";

            m_cli.usage( std::cout, processName );
            std::cout << "For more detail usage please see the project docs\n" << std::endl;
        }